

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_load_certificates(ptls_context_t *ctx,X509 *cert,stack_st_X509 *chain)

{
  int iVar1;
  OPENSSL_STACK *pOVar2;
  size_t sVar3;
  ptls_iovec_t *dst;
  X509 *cert_00;
  size_t sVar4;
  int local_50;
  size_t local_48;
  size_t i_1;
  int i;
  int ret;
  size_t count;
  size_t slot;
  ptls_iovec_t *list;
  stack_st_X509 *chain_local;
  X509 *cert_local;
  ptls_context_t *ctx_local;
  
  count = 0;
  if (chain == (stack_st_X509 *)0x0) {
    local_50 = 0;
  }
  else {
    pOVar2 = ossl_check_const_X509_sk_type(chain);
    local_50 = OPENSSL_sk_num(pOVar2);
  }
  sVar3 = (size_t)(int)((uint)(cert != (X509 *)0x0) + local_50);
  if ((ctx->certificates).list != (ptls_iovec_t *)0x0) {
    __assert_fail("ctx->certificates.list == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                  0x66b,
                  "int ptls_openssl_load_certificates(ptls_context_t *, X509 *, struct stack_st_X509 *)"
                 );
  }
  dst = (ptls_iovec_t *)malloc(sVar3 << 4);
  if (dst == (ptls_iovec_t *)0x0) {
    i_1._4_4_ = 0x201;
  }
  else {
    if (cert != (X509 *)0x0) {
      count = 1;
      i_1._4_4_ = serialize_cert(cert,dst);
      if (i_1._4_4_ != 0) goto LAB_0013b995;
    }
    if (chain != (stack_st_X509 *)0x0) {
      i_1._0_4_ = 0;
      while( true ) {
        pOVar2 = ossl_check_const_X509_sk_type(chain);
        iVar1 = OPENSSL_sk_num(pOVar2);
        if ((int)i_1 == iVar1) break;
        pOVar2 = ossl_check_const_X509_sk_type(chain);
        cert_00 = (X509 *)OPENSSL_sk_value(pOVar2,(int)i_1);
        sVar4 = count + 1;
        i_1._4_4_ = serialize_cert(cert_00,dst + count);
        count = sVar4;
        if (i_1._4_4_ != 0) goto LAB_0013b995;
        i_1._0_4_ = (int)i_1 + 1;
      }
    }
    if (count != sVar3) {
      __assert_fail("slot == count",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                    0x67d,
                    "int ptls_openssl_load_certificates(ptls_context_t *, X509 *, struct stack_st_X509 *)"
                   );
    }
    (ctx->certificates).list = dst;
    (ctx->certificates).count = sVar3;
    i_1._4_4_ = 0;
  }
LAB_0013b995:
  if ((i_1._4_4_ != 0) && (dst != (ptls_iovec_t *)0x0)) {
    for (local_48 = 0; local_48 != count; local_48 = local_48 + 1) {
      free(dst[local_48].base);
    }
    free(dst);
  }
  return i_1._4_4_;
}

Assistant:

int ptls_openssl_load_certificates(ptls_context_t *ctx, X509 *cert, STACK_OF(X509) * chain)
{
    ptls_iovec_t *list = NULL;
    size_t slot = 0, count = (cert != NULL) + (chain != NULL ? sk_X509_num(chain) : 0);
    int ret;

    assert(ctx->certificates.list == NULL);

    if ((list = malloc(sizeof(*list) * count)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (cert != NULL) {
        if ((ret = serialize_cert(cert, list + slot++)) != 0)
            goto Exit;
    }
    if (chain != NULL) {
        int i;
        for (i = 0; i != sk_X509_num(chain); ++i) {
            if ((ret = serialize_cert(sk_X509_value(chain, i), list + slot++)) != 0)
                goto Exit;
        }
    }

    assert(slot == count);

    ctx->certificates.list = list;
    ctx->certificates.count = count;
    ret = 0;

Exit:
    if (ret != 0 && list != NULL) {
        size_t i;
        for (i = 0; i != slot; ++i)
            free(list[i].base);
        free(list);
    }
    return ret;
}